

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

AssertionResult __thiscall
testing::internal::CmpHelperSTRNE
          (internal *this,char *s1_expression,char *s2_expression,wchar_t *s1,wchar_t *s2)

{
  int iVar1;
  AssertionResult *pAVar2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  wchar_t **value;
  wchar_t **value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar4;
  AssertionResult local_90;
  string local_80;
  string local_60;
  char *local_40;
  char *s1_expression_local;
  char *s2_expression_local;
  wchar_t *s1_local;
  wchar_t *s2_local;
  
  sVar3.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71((int7)((ulong)s2_expression >> 8),
                        s2 == (wchar_t *)0x0 || s1 == (wchar_t *)0x0);
  local_40 = s1_expression;
  s1_expression_local = s2_expression;
  s2_expression_local = (char *)s1;
  s1_local = s2;
  if (s2 == (wchar_t *)0x0 || s1 == (wchar_t *)0x0) {
    if (s1 != (wchar_t *)0x0 || s2 != (wchar_t *)0x0) {
LAB_00149003:
      *this = (internal)0x1;
      *(undefined8 *)(this + 8) = 0;
      goto LAB_0014900f;
    }
  }
  else {
    iVar1 = wcscmp(s1,s2);
    sVar3.ptr_ = extraout_RDX_00;
    if (iVar1 != 0) goto LAB_00149003;
  }
  local_90.success_ = false;
  local_90.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pAVar2 = AssertionResult::operator<<(&local_90,(char (*) [12])"Expected: (");
  pAVar2 = AssertionResult::operator<<(pAVar2,&local_40);
  pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])") != (");
  pAVar2 = AssertionResult::operator<<(pAVar2,&s1_expression_local);
  pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [12])"), actual: ");
  PrintToString<wchar_t_const*>(&local_80,(testing *)&s2_expression_local,value);
  pAVar2 = AssertionResult::operator<<(pAVar2,&local_80);
  pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" vs ");
  PrintToString<wchar_t_const*>(&local_60,(testing *)&s1_local,value_00);
  pAVar2 = AssertionResult::operator<<(pAVar2,&local_60);
  AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  sVar3.ptr_ = extraout_RDX;
LAB_0014900f:
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperSTRNE(const char* s1_expression,
                               const char* s2_expression,
                               const wchar_t* s1,
                               const wchar_t* s2) {
  if (!String::WideCStringEquals(s1, s2)) {
    return AssertionSuccess();
  }

  return AssertionFailure() << "Expected: (" << s1_expression << ") != ("
                            << s2_expression << "), actual: "
                            << PrintToString(s1)
                            << " vs " << PrintToString(s2);
}